

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O0

void __thiscall o3dgc::BinaryStream::WriteUIntASCII(BinaryStream *this,unsigned_long value)

{
  ulong uVar1;
  uchar local_1c;
  char local_1b;
  uchar local_1a [2];
  uchar b;
  uchar a;
  unsigned_long uStack_18;
  unsigned_long value_local;
  BinaryStream *this_local;
  
  uStack_18 = value;
  value_local = (unsigned_long)this;
  if (value < 0x7f) {
    local_1c = (uchar)value;
    Vector<unsigned_char>::PushBack(&this->m_stream,&local_1c);
  }
  else {
    local_1a[1] = 0x7f;
    Vector<unsigned_char>::PushBack(&this->m_stream,local_1a + 1);
    uStack_18 = uStack_18 - 0x7f;
    do {
      uVar1 = uStack_18 & 0x3f;
      uStack_18 = uStack_18 >> 6;
      local_1b = uStack_18 != 0;
      local_1a[0] = (char)(uVar1 << 1) + local_1b;
      Vector<unsigned_char>::PushBack(&this->m_stream,local_1a);
    } while (local_1b != '\0');
  }
  return;
}

Assistant:

void                    WriteUIntASCII(unsigned long value) 
                                {
                                    if (value >= O3DGC_BINARY_STREAM_MAX_SYMBOL0)
                                    {
                                        m_stream.PushBack(O3DGC_BINARY_STREAM_MAX_SYMBOL0);
                                        value -= O3DGC_BINARY_STREAM_MAX_SYMBOL0;
                                        unsigned char a, b;
                                        do
                                        {
                                            a  = ((value & O3DGC_BINARY_STREAM_MAX_SYMBOL1) << 1);
                                            b  = ( (value >>= O3DGC_BINARY_STREAM_BITS_PER_SYMBOL1) > 0);
                                            a += b;
                                            m_stream.PushBack(a);
                                        } while (b);
                                    }
                                    else
                                    {
                                        m_stream.PushBack((unsigned char) value);
                                    }
                                }